

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::getVertexArrayConfiguration
          (LimitTest *this,_iteration iteration,attributeConfiguration *out_configuration)

{
  GLint GVar1;
  GLint max_vertex_attribs;
  attributeConfiguration *out_configuration_local;
  _iteration iteration_local;
  LimitTest *this_local;
  
  GVar1 = Base::GetMaxVertexAttribs(&this->super_Base);
  switch(iteration) {
  case DOUBLE_DVEC2:
    out_configuration->m_n_attributes_per_group = GVar1 / 2;
    out_configuration->m_n_elements = getVertexArrayConfiguration::n_elements;
    out_configuration->m_n_rows = getVertexArrayConfiguration::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names = getVertexArrayConfiguration::type_names;
    break;
  case DVEC3_DVEC4:
    out_configuration->m_n_attributes_per_group = GVar1 / 4;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
    break;
  case DMAT2:
    out_configuration->m_n_attributes_per_group = GVar1 / 2;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 1;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
    break;
  case DMAT3X2_DMAT4X2:
    out_configuration->m_n_attributes_per_group = GVar1 / 8;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
    break;
  case DMAT2X3_DMAT2X4:
    out_configuration->m_n_attributes_per_group = GVar1 / 8;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
    break;
  case DMAT3_DMAT3X4:
    out_configuration->m_n_attributes_per_group = GVar1 / 0xc;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
    break;
  case DMAT4X3_DMAT4:
    out_configuration->m_n_attributes_per_group = GVar1 / 0x10;
    out_configuration->m_n_elements =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_elements;
    out_configuration->m_n_rows =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::n_rows;
    out_configuration->m_n_types = 2;
    out_configuration->m_type_names =
         getVertexArrayConfiguration(VertexAttrib64Bit::LimitTest::_iteration,VertexAttrib64Bit::LimitTest::attributeConfiguration&)
         ::type_names;
  }
  calculateVertexLength(this,out_configuration);
  return;
}

Assistant:

void LimitTest::getVertexArrayConfiguration(_iteration iteration, attributeConfiguration& out_configuration) const
{
	static const GLuint n_elements_per_scalar = 1;
	static const GLuint n_elements_per_vec2   = 2;
	static const GLuint n_elements_per_vec3   = 3;
	static const GLuint n_elements_per_vec4   = 4;
	static const GLuint n_elements_per_mat2   = 4;
	static const GLuint n_elements_per_mat2x3 = 6;
	static const GLuint n_elements_per_mat2x4 = 8;
	static const GLuint n_elements_per_mat3   = 9;
	static const GLuint n_elements_per_mat3x2 = 6;
	static const GLuint n_elements_per_mat3x4 = 12;
	static const GLuint n_elements_per_mat4   = 16;
	static const GLuint n_elements_per_mat4x2 = 8;
	static const GLuint n_elements_per_mat4x3 = 12;

	const GLint max_vertex_attribs = GetMaxVertexAttribs();

	switch (iteration)
	{
	case DOUBLE_DVEC2:
	{
		static const GLint n_elements[] = { n_elements_per_scalar, n_elements_per_vec2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 2;

		static const GLchar* type_names[] = { "double", "dvec2" };

		static const GLint n_rows[] = {
			1, 2,
		};

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DVEC3_DVEC4:
	{
		static const GLint n_elements[] = { n_elements_per_vec3, n_elements_per_vec4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 4;

		static const GLchar* type_names[] = { "dvec3", "dvec4" };

		static const GLint n_rows[] = {
			3, 4,
		};

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT2:
	{
		static const GLint n_elements[] = { n_elements_per_mat2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 2;

		static const GLchar* type_names[] = { "dmat2" };

		static const GLint n_rows[] = { 2 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT3X2_DMAT4X2:
	{
		static const GLint n_elements[] = { n_elements_per_mat3x2, n_elements_per_mat4x2 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 8;

		static const GLchar* type_names[] = { "dmat3x2", "dmat4x2" };

		static const GLint n_rows[] = { 2, 2 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT2X3_DMAT2X4:
	{
		static const GLint n_elements[] = { n_elements_per_mat2x3, n_elements_per_mat2x4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 8;

		static const GLchar* type_names[] = { "dmat2x3", "dmat2x4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT3_DMAT3X4:
	{
		static const GLint n_elements[] = { n_elements_per_mat3, n_elements_per_mat3x4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 12;

		static const GLchar* type_names[] = { "dmat3", "dmat3x4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	case DMAT4X3_DMAT4:
	{
		static const GLint n_elements[] = { n_elements_per_mat4x3, n_elements_per_mat4 };
		static const GLint n_types		= sizeof(n_elements) / sizeof(n_elements[0]);

		static const GLint divisor = 16;

		static const GLchar* type_names[] = { "dmat4x3", "dmat4" };

		static const GLint n_rows[] = { 3, 4 };

		out_configuration.m_n_attributes_per_group = max_vertex_attribs / divisor;
		out_configuration.m_n_elements			   = n_elements;
		out_configuration.m_n_rows				   = n_rows;
		out_configuration.m_n_types				   = n_types;
		out_configuration.m_type_names			   = type_names;
	}
	break;
	}

	calculateVertexLength(out_configuration);
}